

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  uint uVar1;
  Expr *pExpr;
  ExprList *pEVar2;
  Select *pSVar3;
  int iVar4;
  Expr *p;
  ExprList_item *pEVar5;
  long lVar6;
  u16 uVar7;
  int iVar8;
  int iCol;
  int local_60;
  int local_5c;
  Parse *local_58;
  char *local_50;
  NameContext *local_48;
  Select *local_40;
  Expr *local_38;
  
  if (pOrderBy == (ExprList *)0x0) {
    return 0;
  }
  local_60 = pSelect->pEList->nExpr;
  local_58 = pNC->pParse;
  pEVar5 = pOrderBy->a;
  iVar8 = 0;
  local_50 = zType;
  local_48 = pNC;
  local_40 = pSelect;
  local_38 = (Expr *)pOrderBy;
  do {
    pSVar3 = local_40;
    iVar4._0_1_ = local_38->op;
    iVar4._1_1_ = local_38->affinity;
    iVar4._2_2_ = local_38->flags;
    if (iVar4 <= iVar8) {
      iVar8 = sqlite3ResolveOrderGroupBy(local_58,local_40,(ExprList *)local_38,local_50);
      return iVar8;
    }
    pExpr = pEVar5->pExpr;
    iCol = resolveAsName((Parse *)local_40->pEList,(ExprList *)pExpr,local_38);
    local_5c = iVar8;
    if (iCol < 1) {
      p = sqlite3ExprSkipCollate(pExpr);
      iVar4 = sqlite3ExprIsInteger(p,&iCol);
      if (iVar4 != 0) {
        if (iCol - 0x10000U < 0xffff0001) {
          resolveOutOfRangeError(local_58,local_50,iVar8 + 1,local_60);
          return 1;
        }
        goto LAB_00151b3f;
      }
      pEVar5->iOrderByCol = 0;
      iVar8 = sqlite3ResolveExprNames(local_48,pExpr);
      if (iVar8 != 0) {
        return 1;
      }
      pEVar2 = pSVar3->pEList;
      uVar1 = pEVar2->nExpr;
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      uVar7 = 1;
      for (lVar6 = 0; (ulong)uVar1 * 0x20 != lVar6; lVar6 = lVar6 + 0x20) {
        iVar8 = sqlite3ExprCompare(pExpr,*(Expr **)((long)&pEVar2->a->pExpr + lVar6));
        if (iVar8 == 0) {
          pEVar5->iOrderByCol = uVar7;
        }
        uVar7 = uVar7 + 1;
      }
    }
    else {
LAB_00151b3f:
      pEVar5->iOrderByCol = (u16)iCol;
    }
    iVar8 = local_5c + 1;
    pEVar5 = pEVar5 + 1;
  } while( true );
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    iCol = resolveAsName(pParse, pSelect->pEList, pE);
    if( iCol>0 ){
      /* If an AS-name match is found, mark this ORDER BY column as being
      ** a copy of the iCol-th result-set column.  The subsequent call to
      ** sqlite3ResolveOrderGroupBy() will convert the expression to a
      ** copy of the iCol-th result-set expression. */
      pItem->iOrderByCol = (u16)iCol;
      continue;
    }
    if( sqlite3ExprIsInteger(sqlite3ExprSkipCollate(pE), &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(pE, pSelect->pEList->a[j].pExpr)==0 ){
        pItem->iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}